

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall
PiecewiseConstant1D_InverseUniform_Test::PiecewiseConstant1D_InverseUniform_Test
          (PiecewiseConstant1D_InverseUniform_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__PiecewiseConstant1D_InverseUniform_Test_037454b8;
  return;
}

Assistant:

TEST(PiecewiseConstant1D, InverseUniform) {
    std::vector<Float> values = {Float(1), Float(1), Float(1)};

    PiecewiseConstant1D dist(values);
    EXPECT_EQ(0, *dist.Invert(0));
    EXPECT_EQ(0.5, *dist.Invert(0.5));
    EXPECT_EQ(0.75, *dist.Invert(0.75));

    PiecewiseConstant1D dist2(values, -1, 3);
    EXPECT_EQ(0, *dist2.Invert(-1));
    EXPECT_EQ(0.25, *dist2.Invert(0));
    EXPECT_EQ(0.5, *dist2.Invert(1));
    EXPECT_EQ(0.75, *dist2.Invert(2));
    EXPECT_EQ(1, *dist2.Invert(3));
}